

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYRef<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLog>
               (GetterXsYRef<int> *getter1,GetterXsYRef<int> *getter2,TransformerLinLog *transformer
               ,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  float fVar11;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  int local_6c;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<int> *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_68 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYRef<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYRef<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_6c = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_6c = getter1->Count;
    }
    if (0 < local_6c) {
      iVar10 = 0;
      do {
        pIVar8 = GImPlot;
        iVar4 = getter1->Count;
        iVar4 = *(int *)((long)getter1->Xs +
                        (long)(((getter1->Offset + iVar10) % iVar4 + iVar4) % iVar4) *
                        (long)getter1->Stride);
        dVar7 = log10(getter1->YRef / GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar9 = GImPlot;
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar8->CurrentPlot;
        dVar3 = pIVar6->YAxis[iVar5].Range.Min;
        local_58._0_4_ =
             (undefined4)
             (((double)iVar4 - (pIVar6->XAxis).Range.Min) * pIVar8->Mx +
             (double)pIVar8->PixelRange[iVar5].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar7 / pIVar8->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                     pIVar8->My[iVar5] + (double)pIVar8->PixelRange[iVar5].Min.y);
        iVar4 = getter2->Count;
        iVar4 = *(int *)((long)getter2->Xs +
                        (long)(((getter2->Offset + iVar10) % iVar4 + iVar4) % iVar4) *
                        (long)getter2->Stride);
        dVar7 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar5].Range.Min);
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        dVar3 = pIVar6->YAxis[iVar5].Range.Min;
        local_78.x = (float)(((double)iVar4 - (pIVar6->XAxis).Range.Min) * pIVar9->Mx +
                            (double)pIVar9->PixelRange[iVar5].Min.x);
        fVar11 = (float)((((double)(float)(dVar7 / pIVar9->LogDenY[iVar5]) *
                           (pIVar6->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar9->My[iVar5] + (double)pIVar9->PixelRange[iVar5].Min.y);
        local_78.y = fVar11;
        pIVar6 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar2 = fVar11;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                           local_58._4_4_ & -(uint)(fVar11 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar2 = local_78.x;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_78,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
      } while (local_6c != iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}